

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int get_next_job_allintra
              (AV1EncRowMultiThreadSync *row_mt_sync,int mi_row_end,int *current_mi_row,int mib_size
              )

{
  bool bVar1;
  int mib_size_local;
  int *current_mi_row_local;
  int mi_row_end_local;
  AV1EncRowMultiThreadSync *row_mt_sync_local;
  uint local_4;
  
  bVar1 = row_mt_sync->next_mi_row < mi_row_end;
  if (bVar1) {
    *current_mi_row = row_mt_sync->next_mi_row;
    row_mt_sync->num_threads_working = row_mt_sync->num_threads_working + 1;
    row_mt_sync->next_mi_row = mib_size + row_mt_sync->next_mi_row;
  }
  local_4 = (uint)bVar1;
  return local_4;
}

Assistant:

static inline int get_next_job_allintra(
    AV1EncRowMultiThreadSync *const row_mt_sync, const int mi_row_end,
    int *current_mi_row, int mib_size) {
  if (row_mt_sync->next_mi_row < mi_row_end) {
    *current_mi_row = row_mt_sync->next_mi_row;
    row_mt_sync->num_threads_working++;
    row_mt_sync->next_mi_row += mib_size;
    return 1;
  }
  return 0;
}